

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
* TasGrid::IO::getStringRuleMap_abi_cxx11_(void)

{
  long lVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  *in_RDI;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  __l;
  allocator_type local_786;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_785;
  TypeOneDRule local_784 [43];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_660;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_610;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_5c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_548;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_4d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_3b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_340;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_48;
  
  local_784[0x2a] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[5],_TasGrid::TypeOneDRule,_true>
            (&local_6d8,(char (*) [5])"none",local_784 + 0x2a);
  local_784[0x29] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[16],_TasGrid::TypeOneDRule,_true>
            (&local_6b0,(char (*) [16])"clenshaw-curtis",local_784 + 0x29);
  local_784[0x28] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (&local_688,(char (*) [21])"clenshaw-curtis-zero",local_784 + 0x28);
  local_784[0x27] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[10],_TasGrid::TypeOneDRule,_true>
            (&local_660,(char (*) [10])"chebyshev",local_784 + 0x27);
  local_784[0x26] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (&local_638,(char (*) [14])"chebyshev-odd",local_784 + 0x26);
  local_784[0x25] = 0x15;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[15],_TasGrid::TypeOneDRule,_true>
            (&local_610,(char (*) [15])"gauss-legendre",local_784 + 0x25);
  local_784[0x24] = 0x16;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[19],_TasGrid::TypeOneDRule,_true>
            (&local_5e8,(char (*) [19])"gauss-legendre-odd",local_784 + 0x24);
  local_784[0x23] = 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[16],_TasGrid::TypeOneDRule,_true>
            (&local_5c0,(char (*) [16])"gauss-patterson",local_784 + 0x23);
  local_784[0x22] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[5],_TasGrid::TypeOneDRule,_true>
            (&local_598,(char (*) [5])0x113063,local_784 + 0x22);
  local_784[0x21] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[9],_TasGrid::TypeOneDRule,_true>
            (&local_570,(char (*) [9])0x113085,local_784 + 0x21);
  local_784[0x20] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[6],_TasGrid::TypeOneDRule,_true>
            (&local_548,(char (*) [6])"rleja",local_784 + 0x20);
  local_784[0x1f] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (&local_520,(char (*) [14])"rleja-double2",local_784 + 0x1f);
  local_784[0x1e] = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (&local_4f8,(char (*) [14])"rleja-double4",local_784 + 0x1e);
  local_784[0x1d] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[10],_TasGrid::TypeOneDRule,_true>
            (&local_4d0,(char (*) [10])"rleja-odd",local_784 + 0x1d);
  local_784[0x1c] = 0xc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (&local_4a8,(char (*) [14])"rleja-shifted",local_784 + 0x1c);
  local_784[0x1b] = 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[19],_TasGrid::TypeOneDRule,_true>
            (&local_480,(char (*) [19])"rleja-shifted-even",local_784 + 0x1b);
  local_784[0x1a] = 0xe;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (&local_458,(char (*) [21])"rleja-shifted-double",local_784 + 0x1a);
  local_784[0x19] = 0xf;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[13],_TasGrid::TypeOneDRule,_true>
            (&local_430,(char (*) [13])"max-lebesgue",local_784 + 0x19);
  local_784[0x18] = 0x10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_408,(char (*) [17])"max-lebesgue-odd",local_784 + 0x18);
  local_784[0x17] = 0x11;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[13],_TasGrid::TypeOneDRule,_true>
            (&local_3e0,(char (*) [13])"min-lebesgue",local_784 + 0x17);
  local_784[0x16] = 0x12;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_3b8,(char (*) [17])"min-lebesgue-odd",local_784 + 0x16);
  local_784[0x15] = 0x13;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[10],_TasGrid::TypeOneDRule,_true>
            (&local_390,(char (*) [10])"min-delta",local_784 + 0x15);
  local_784[0x14] = 0x14;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (&local_368,(char (*) [14])"min-delta-odd",local_784 + 0x14);
  local_784[0x13] = 0x18;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_340,(char (*) [17])"gauss-chebyshev1",local_784 + 0x13);
  local_784[0x12] = 0x19;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (&local_318,(char (*) [21])"gauss-chebyshev1-odd",local_784 + 0x12);
  local_784[0x11] = 0x1a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_2f0,(char (*) [17])"gauss-chebyshev2",local_784 + 0x11);
  local_784[0x10] = 0x1b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (&local_2c8,(char (*) [21])"gauss-chebyshev2-odd",local_784 + 0x10);
  local_784[0xf] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[7],_TasGrid::TypeOneDRule,_true>
            (&local_2a0,(char (*) [7])"fejer2",local_784 + 0xf);
  local_784[0xe] = 0x1c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_278,(char (*) [17])"gauss-gegenbauer",local_784 + 0xe);
  local_784[0xd] = 0x1d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (&local_250,(char (*) [21])"gauss-gegenbauer-odd",local_784 + 0xd);
  local_784[0xc] = 0x1e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[13],_TasGrid::TypeOneDRule,_true>
            (&local_228,(char (*) [13])"gauss-jacobi",local_784 + 0xc);
  local_784[0xb] = 0x1f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_200,(char (*) [17])"gauss-jacobi-odd",local_784 + 0xb);
  local_784[10] = 0x20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[15],_TasGrid::TypeOneDRule,_true>
            (&local_1d8,(char (*) [15])"gauss-laguerre",local_784 + 10);
  local_784[9] = 0x21;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[19],_TasGrid::TypeOneDRule,_true>
            (&local_1b0,(char (*) [19])"gauss-laguerre-odd",local_784 + 9);
  local_784[8] = 0x22;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (&local_188,(char (*) [14])"gauss-hermite",local_784 + 8);
  local_784[7] = 0x23;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[18],_TasGrid::TypeOneDRule,_true>
            (&local_160,(char (*) [18])"gauss-hermite-odd",local_784 + 7);
  local_784[6] = 0x24;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (&local_138,(char (*) [17])"custom-tabulated",local_784 + 6);
  local_784[5] = 0x25;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[7],_TasGrid::TypeOneDRule,_true>
            (&local_110,(char (*) [7])0x113223,local_784 + 5);
  local_784[4] = 0x26;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[12],_TasGrid::TypeOneDRule,_true>
            (&local_e8,(char (*) [12])"localp-zero",local_784 + 4);
  local_784[3] = 0x28;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[16],_TasGrid::TypeOneDRule,_true>
            (&local_c0,(char (*) [16])"localp-boundary",local_784 + 3);
  local_784[2] = 0x27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[12],_TasGrid::TypeOneDRule,_true>
            (&local_98,(char (*) [12])"semi-localp",local_784 + 2);
  local_784[1] = 0x29;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[8],_TasGrid::TypeOneDRule,_true>
            (&local_70,(char (*) [8])"wavelet",local_784 + 1);
  local_784[0] = rule_fourier;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[8],_TasGrid::TypeOneDRule,_true>
            (&local_48,(char (*) [8])"fourier",local_784);
  __l._M_len = 0x2b;
  __l._M_array = &local_6d8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  ::map(in_RDI,__l,&local_785,&local_786);
  lVar1 = 0x690;
  do {
    std::__cxx11::string::~string((string *)((long)&local_6d8.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeOneDRule> getStringRuleMap(){
    return std::initializer_list<std::pair<std::string const, TypeOneDRule>>{
        {"none",                 rule_none},
        {"clenshaw-curtis",      rule_clenshawcurtis},
        {"clenshaw-curtis-zero", rule_clenshawcurtis0},
        {"chebyshev",            rule_chebyshev},
        {"chebyshev-odd",        rule_chebyshevodd},
        {"gauss-legendre",       rule_gausslegendre},
        {"gauss-legendre-odd",   rule_gausslegendreodd},
        {"gauss-patterson",      rule_gausspatterson},
        {"leja",                 rule_leja},
        {"leja-odd",             rule_lejaodd},
        {"rleja",                rule_rleja},
        {"rleja-double2",        rule_rlejadouble2},
        {"rleja-double4",        rule_rlejadouble4},
        {"rleja-odd",            rule_rlejaodd},
        {"rleja-shifted",        rule_rlejashifted},
        {"rleja-shifted-even",   rule_rlejashiftedeven},
        {"rleja-shifted-double", rule_rlejashifteddouble},
        {"max-lebesgue",         rule_maxlebesgue},
        {"max-lebesgue-odd",     rule_maxlebesgueodd},
        {"min-lebesgue",         rule_minlebesgue},
        {"min-lebesgue-odd",     rule_minlebesgueodd},
        {"min-delta",            rule_mindelta},
        {"min-delta-odd",        rule_mindeltaodd},
        {"gauss-chebyshev1",     rule_gausschebyshev1},
        {"gauss-chebyshev1-odd", rule_gausschebyshev1odd},
        {"gauss-chebyshev2",     rule_gausschebyshev2},
        {"gauss-chebyshev2-odd", rule_gausschebyshev2odd},
        {"fejer2",               rule_fejer2},
        {"gauss-gegenbauer",     rule_gaussgegenbauer},
        {"gauss-gegenbauer-odd", rule_gaussgegenbauerodd},
        {"gauss-jacobi",         rule_gaussjacobi},
        {"gauss-jacobi-odd",     rule_gaussjacobiodd},
        {"gauss-laguerre",       rule_gausslaguerre},
        {"gauss-laguerre-odd",   rule_gausslaguerreodd},
        {"gauss-hermite",        rule_gausshermite},
        {"gauss-hermite-odd",    rule_gausshermiteodd},
        {"custom-tabulated",     rule_customtabulated},
        {"localp",               rule_localp},
        {"localp-zero",          rule_localp0},
        {"localp-boundary",      rule_localpb},
        {"semi-localp",          rule_semilocalp},
        {"wavelet",              rule_wavelet},
        {"fourier",              rule_fourier}};
}